

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void google::protobuf::EnumDescriptorProto_EnumReservedRange::MergeImpl
               (MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  EnumDescriptorProto_EnumReservedRange **v1;
  EnumDescriptorProto_EnumReservedRange **v2;
  LogMessage *pLVar2;
  uint32_t *puVar3;
  undefined1 auVar4 [16];
  uint32_t cached_has_bits;
  LogMessageFatal local_50 [23];
  Voidify local_39;
  EnumDescriptorProto_EnumReservedRange *local_38;
  string *local_30;
  string *absl_log_internal_check_op_result;
  EnumDescriptorProto_EnumReservedRange *from;
  EnumDescriptorProto_EnumReservedRange *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  
  local_38 = (EnumDescriptorProto_EnumReservedRange *)from_msg;
  absl_log_internal_check_op_result = (string *)from_msg;
  from = (EnumDescriptorProto_EnumReservedRange *)to_msg;
  _this = (EnumDescriptorProto_EnumReservedRange *)from_msg;
  from_msg_local = to_msg;
  v1 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::EnumDescriptorProto_EnumReservedRange_const*>
                 (&local_38);
  v2 = absl::lts_20240722::log_internal::
       GetReferenceableValue<google::protobuf::EnumDescriptorProto_EnumReservedRange*>(&from);
  local_30 = absl::lts_20240722::log_internal::
             Check_NEImpl<google::protobuf::EnumDescriptorProto_EnumReservedRange_const*,google::protobuf::EnumDescriptorProto_EnumReservedRange*>
                       (v1,v2,"&from != _this");
  if (local_30 == (string *)0x0) {
    puVar3 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&absl_log_internal_check_op_result->field_2,0);
    uVar1 = *puVar3;
    if ((uVar1 & 3) != 0) {
      if ((uVar1 & 1) != 0) {
        (from->field_0)._impl_.start_ =
             *(int32_t *)((long)&absl_log_internal_check_op_result->field_2 + 8);
      }
      if ((uVar1 & 2) != 0) {
        (from->field_0)._impl_.end_ =
             *(int32_t *)((long)&absl_log_internal_check_op_result->field_2 + 0xc);
      }
    }
    puVar3 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
    *puVar3 = uVar1 | *puVar3;
    internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
              (&(from->super_Message).super_MessageLite._internal_metadata_,
               (InternalMetadata *)&absl_log_internal_check_op_result->_M_string_length);
    return;
  }
  auVar4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_50,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/descriptor.pb.cc"
             ,0x19a5,auVar4._0_8_,auVar4._8_8_);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_50);
  absl::lts_20240722::log_internal::Voidify::operator&&(&local_39,pLVar2);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_50);
}

Assistant:

void EnumDescriptorProto_EnumReservedRange::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<EnumDescriptorProto_EnumReservedRange*>(&to_msg);
  auto& from = static_cast<const EnumDescriptorProto_EnumReservedRange&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.EnumDescriptorProto.EnumReservedRange)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x00000003u) {
    if (cached_has_bits & 0x00000001u) {
      _this->_impl_.start_ = from._impl_.start_;
    }
    if (cached_has_bits & 0x00000002u) {
      _this->_impl_.end_ = from._impl_.end_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}